

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::ClassDecl> __thiscall
mocker::Parser::classDecl(Parser *this,TokIter *iter,TokIter end)

{
  TokIter iter_00;
  size_t sVar1;
  shared_ptr<mocker::ast::Type> *args;
  Token *this_00;
  Position end_00;
  __type _Var2;
  TokenID TVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  mapped_type *pmVar4;
  undefined8 extraout_RAX;
  Token *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<mocker::ast::ClassDecl> sVar6;
  Position beg;
  Position beg_00;
  Position beg_01;
  Position end_01;
  Position end_02;
  GetTokenID id;
  shared_ptr<mocker::ast::Declaration> member;
  pair<mocker::Position,_mocker::Position> ctorPos;
  shared_ptr<mocker::ast::CompoundStmt> body;
  shared_ptr<mocker::ast::Identifier> ident;
  anon_class_24_2_341b408a local_e0;
  shared_ptr<mocker::ast::Identifier> local_c8;
  element_type *local_b8;
  size_t local_b0;
  size_t local_a8;
  Token *local_a0;
  Token *local_98;
  Parser local_90;
  shared_ptr<mocker::ast::FuncDecl> ctor;
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  local_68;
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  members;
  
  Token::position(*end._M_current);
  local_a8 = ctorPos.first.line;
  local_b0 = ctorPos.first.col;
  local_e0.iter = (TokIter *)end._M_current;
  TVar3 = GetTokenID::operator()(&id,*end._M_current);
  if (TVar3 != Class) {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
    _Var5._M_pi = extraout_RDX;
    goto LAB_001737aa;
  }
  *(long *)end._M_current = *(long *)end._M_current + 0x38;
  local_b8 = (element_type *)this;
  identifier((Parser *)&ident,iter,end);
  if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iter_00._M_current = *end._M_current;
    *(Token **)end._M_current = iter_00._M_current + 1;
    TVar3 = GetTokenID::operator()(&id,iter_00);
    if (TVar3 == LeftBrace) {
      members.
      super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      members.
      super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      members.
      super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0 = end._M_current;
      local_98 = in_RCX;
      while( true ) {
        declaration((Parser *)&member,iter,end);
        if (member.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (element_type *)0x0) break;
        std::
        vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
        ::emplace_back<std::shared_ptr<mocker::ast::Declaration>&>
                  ((vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
                    *)&members,&member);
LAB_0017370c:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&member.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      TVar3 = GetTokenID::operator()(&id,*end._M_current);
      if (TVar3 == Identifier) {
        TVar3 = GetTokenID::operator()(&id,(Token *)(*(long *)end._M_current + 0x38));
        if (TVar3 == LeftParen) {
          __lhs = Token::val<std::__cxx11::string>(*end._M_current);
          _Var2 = std::operator==(__lhs,&(ident.
                                          super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->val);
          if (_Var2) {
            if (*end._M_current + 3 < in_RCX) {
              Token::position(*end._M_current);
              *(long *)end._M_current = *(long *)end._M_current + 0xa8;
              compoundStmt((Parser *)&body,iter,end);
              if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                local_90.pos = (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                                *)body.
                                  super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr;
                pmVar4 = std::__detail::
                         _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)iter[2]._M_current,(key_type *)&local_90.pos);
                sVar1 = (pmVar4->second).line;
                args = (shared_ptr<mocker::ast::Type> *)(pmVar4->second).col;
                local_c8.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                local_c8.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                end_00.col = ctorPos.second.line;
                end_00.line = ctorPos.first.col;
                beg.col = ctorPos.first.line;
                beg.line = (size_t)iter;
                makeNode<mocker::ast::Identifier,char_const(&)[7]>
                          (&local_90,beg,end_00,(char (*) [7])ctorPos.second.col);
                local_68.
                super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_68.
                super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_68.
                super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                beg_00.col = ctorPos.first.line;
                beg_00.line = (size_t)iter;
                end_01.col = sVar1;
                end_01.line = ctorPos.first.col;
                makeNode<mocker::ast::FuncDecl,std::shared_ptr<mocker::ast::Type>,std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>,std::shared_ptr<mocker::ast::CompoundStmt>&>
                          ((Parser *)&ctor,beg_00,end_01,args,&local_c8,
                           (vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                            *)&local_90,(shared_ptr<mocker::ast::CompoundStmt> *)&local_68);
                std::
                vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                ::~vector(&local_68);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90.tokEnd);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_c8.
                            super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::
                vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
                ::emplace_back<std::shared_ptr<mocker::ast::FuncDecl>&>
                          ((vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
                            *)&members,&ctor);
                in_RCX = local_98;
                end._M_current = local_a0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&ctor.
                            super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&body.
                            super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                goto LAB_0017370c;
              }
            }
            else {
              classDecl::anon_class_24_2_341b408a::operator()(&local_e0);
            }
            classDecl::anon_class_24_2_341b408a::operator()(&local_e0);
            goto LAB_001737d3;
          }
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&member.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      TVar3 = GetTokenID::operator()(&id,*end._M_current);
      if (TVar3 == RightBrace) {
        this_00 = *end._M_current;
        *(Token **)end._M_current = this_00 + 1;
        Token::position(this_00);
        this = (Parser *)local_b8;
        beg_01.col = local_a8;
        beg_01.line = (size_t)iter;
        end_02.col = ctorPos.second.line;
        end_02.line = local_b0;
        makeNode<mocker::ast::ClassDecl,std::shared_ptr<mocker::ast::Identifier>&,std::vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>>
                  ((Parser *)local_b8,beg_01,end_02,
                   (shared_ptr<mocker::ast::Identifier> *)ctorPos.second.col,
                   (vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                    *)&ident);
        std::
        vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
        ::~vector(&members);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        _Var5._M_pi = extraout_RDX_00;
LAB_001737aa:
        sVar6.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Var5._M_pi;
        sVar6.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (shared_ptr<mocker::ast::ClassDecl>)
               sVar6.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>;
      }
      goto LAB_001737dd;
    }
  }
LAB_001737d3:
  classDecl::anon_class_24_2_341b408a::operator()(&local_e0);
LAB_001737dd:
  classDecl::anon_class_24_2_341b408a::operator()(&local_e0);
  std::
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  ::~vector(&members);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::shared_ptr<ast::ClassDecl> Parser::classDecl(TokIter &iter, TokIter end) {
  auto id = GetTokenID(end);
  auto begPos = iter->position().first;
  auto throwError = [begPos, &iter] {
    throw SyntaxError(begPos, iter->position().second);
  };

  if (id(iter) != TokenID::Class)
    return nullptr;
  ++iter;
  auto ident = identifier(iter, end);
  if (!ident)
    throwError();
  if (id(iter++) != TokenID::LeftBrace)
    throwError();
  std::vector<std::shared_ptr<ast::Declaration>> members;
  while (true) {
    auto member = declaration(iter, end);
    if (member) {
      members.emplace_back(member);
      continue;
    }
    // ctor
    if (id(iter) == TokenID::Identifier && id(iter + 1) == TokenID::LeftParen &&
        iter->val<std::string>() == ident->val) {
      if (iter + 3 >= end)
        throwError();
      auto ctorPos = iter->position();
      iter += 3;
      auto body = compoundStmt(iter, end);
      if (!body)
        throwError();
      auto ctor = makeNode<ast::FuncDecl>(
          ctorPos.first, pos[body->getID()].second,
          std::shared_ptr<ast::Type>(nullptr),
          makeNode<ast::Identifier>(ctorPos.first, ctorPos.second, "_ctor_"),
          std::vector<std::shared_ptr<ast::VarDeclStmt>>(), body);
      members.emplace_back(ctor);
      continue;
    }
    break;
  }
  if (id(iter) != TokenID::RightBrace)
    throwError();
  return makeNode<ast::ClassDecl>(begPos, (iter++)->position().second, ident,
                                  std::move(members));
}